

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemView::setSelectionModel(QAbstractItemView *this,QItemSelectionModel *selectionModel)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  offset_in_QItemSelectionModel_to_subr signal;
  Object *sender;
  Object *sender_00;
  offset_in_QItemSelectionModel_to_subr signal_00;
  long in_FS_OFFSET;
  Object local_98 [8];
  Object local_90 [8];
  QArrayDataPointer<QItemSelectionRange> local_88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayDataPointer<QItemSelectionRange> local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  lVar3 = QItemSelectionModel::model();
  if (lVar3 == *(long *)(lVar1 + 0x2f8)) {
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    local_70 = 0xffffffffffffffff;
    local_58.d._0_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    this_00 = (QWeakPointer<QObject> *)(lVar1 + 800);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      lVar3 = QItemSelectionModel::model();
      lVar4 = QItemSelectionModel::model();
      if (lVar3 == lVar4) {
        QItemSelectionModel::selection();
        QArrayDataPointer<QItemSelectionRange>::operator=(&local_58,&local_88);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_88);
        QItemSelectionModel::currentIndex();
      }
      if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
        sender = (Object *)0x0;
      }
      else {
        sender = *(Object **)(lVar1 + 0x328);
      }
      sender_00 = (Object *)0x0;
      QObject::
      disconnect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QAbstractItemView::*)(QItemSelection_const&,QItemSelection_const&)>
                (sender,(offset_in_QItemSelectionModel_to_subr)QItemSelectionModel::selectionChanged
                 ,(Object *)0x0,(offset_in_QAbstractItemView_to_subr)this);
      if (this_00->d != (Data *)0x0) {
        if (*(int *)(this_00->d + 4) == 0) {
          sender_00 = (Object *)0x0;
        }
        else {
          sender_00 = *(Object **)(lVar1 + 0x328);
        }
      }
      QObject::
      disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
                (sender_00,
                 (offset_in_QItemSelectionModel_to_subr)QItemSelectionModel::currentChanged,
                 (Object *)0x0,(offset_in_QAbstractItemView_to_subr)this);
    }
    QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)selectionModel);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
        signal = 0;
      }
      else {
        signal = *(offset_in_QItemSelectionModel_to_subr *)(lVar1 + 0x328);
      }
      local_88.d = (Data *)0x249;
      local_88.ptr = (QItemSelectionRange *)0x0;
      signal_00 = 0;
      QObject::
      connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QAbstractItemView::*)(QItemSelection_const&,QItemSelection_const&)>
                (local_90,signal,(ContextType *)QItemSelectionModel::selectionChanged,
                 (offset_in_QAbstractItemView_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_90);
      if (this_00->d != (Data *)0x0) {
        if (*(int *)(this_00->d + 4) == 0) {
          signal_00 = 0;
        }
        else {
          signal_00 = *(offset_in_QItemSelectionModel_to_subr *)(lVar1 + 0x328);
        }
      }
      local_88.d = (Data *)0x251;
      local_88.ptr = (QItemSelectionRange *)0x0;
      QObject::
      connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
                (local_98,signal_00,(ContextType *)QItemSelectionModel::currentChanged,
                 (offset_in_QAbstractItemView_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_98);
      QItemSelectionModel::selection();
      (**(code **)(*(long *)this + 0x248))(this,&local_88,&local_58);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_88);
      QItemSelectionModel::currentIndex();
      (**(code **)(*(long *)this + 0x250))(this,&local_88,&local_70);
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  }
  else {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,
               "QAbstractItemView::setSelectionModel() failed: Trying to set a selection model, which works on a different model than the view."
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setSelectionModel(QItemSelectionModel *selectionModel)
{
    // ### if the given model is null, we should use the original selection model
    Q_ASSERT(selectionModel);
    Q_D(QAbstractItemView);

    if (Q_UNLIKELY(selectionModel->model() != d->model)) {
        qWarning("QAbstractItemView::setSelectionModel() failed: "
                 "Trying to set a selection model, which works on "
                 "a different model than the view.");
        return;
    }

    QItemSelection oldSelection;
    QModelIndex oldCurrentIndex;

    if (d->selectionModel) {
        if (d->selectionModel->model() == selectionModel->model()) {
            oldSelection = d->selectionModel->selection();
            oldCurrentIndex = d->selectionModel->currentIndex();
        }
        disconnect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                   this, &QAbstractItemView::selectionChanged);
        disconnect(d->selectionModel, &QItemSelectionModel::currentChanged,
                   this, &QAbstractItemView::currentChanged);
    }

    d->selectionModel = selectionModel;

    if (d->selectionModel) {
        connect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                this, &QAbstractItemView::selectionChanged);
        connect(d->selectionModel, &QItemSelectionModel::currentChanged,
                this, &QAbstractItemView::currentChanged);

        selectionChanged(d->selectionModel->selection(), oldSelection);
        currentChanged(d->selectionModel->currentIndex(), oldCurrentIndex);
    }
}